

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int ARKodeGetNumNonlinSolvConvFails(void *arkode_mem,long *nnfails)

{
  undefined8 *in_RSI;
  long in_RDI;
  ARKodeMem ark_mem;
  int local_4;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0xa1a,"ARKodeGetNumNonlinSolvConvFails",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (*(long *)(in_RDI + 0x1d8) == 0) {
    *in_RSI = 0;
    local_4 = 0;
  }
  else {
    local_4 = (**(code **)(in_RDI + 0x1d8))(in_RDI,in_RSI);
  }
  return local_4;
}

Assistant:

int ARKodeGetNumNonlinSolvConvFails(void* arkode_mem, long int* nnfails)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Call stepper routine to compute the state (if provided) */
  if (ark_mem->step_getnumnonlinsolvconvfails)
  {
    return (ark_mem->step_getnumnonlinsolvconvfails(ark_mem, nnfails));
  }
  else
  {
    *nnfails = 0;
    return (ARK_SUCCESS);
  }
}